

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O1

string * cfd::js::api::json::JsonMappingApi::BlindRawTransaction
                   (string *__return_storage_ptr__,string *request_message)

{
  function<cfd::js::api::BlindTransactionResponseStruct_(const_cfd::js::api::BlindRawTransactionRequestStruct_&)>
  *in_RCX;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  local_28._8_8_ = 0;
  local_28._0_8_ = ElementsTransactionStructApi::BlindTransaction;
  local_18._8_8_ =
       std::
       _Function_handler<cfd::js::api::BlindTransactionResponseStruct_(const_cfd::js::api::BlindRawTransactionRequestStruct_&),_cfd::js::api::BlindTransactionResponseStruct_(*)(const_cfd::js::api::BlindRawTransactionRequestStruct_&)>
       ::_M_invoke;
  local_18._0_8_ =
       std::
       _Function_handler<cfd::js::api::BlindTransactionResponseStruct_(const_cfd::js::api::BlindRawTransactionRequestStruct_&),_cfd::js::api::BlindTransactionResponseStruct_(*)(const_cfd::js::api::BlindRawTransactionRequestStruct_&)>
       ::_M_manager;
  ExecuteJsonApi<cfd::js::api::json::BlindRawTransactionRequest,cfd::js::api::json::BlindTransactionResponse,cfd::js::api::BlindRawTransactionRequestStruct,cfd::js::api::BlindTransactionResponseStruct>
            (__return_storage_ptr__,(json *)request_message,(string *)local_28,in_RCX);
  if ((code *)local_18._0_8_ != (code *)0x0) {
    (*(code *)local_18._0_8_)(local_28,local_28,3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JsonMappingApi::BlindRawTransaction(
    const std::string &request_message) {
  return ExecuteJsonApi<
      api::json::BlindRawTransactionRequest,
      api::json::BlindTransactionResponse,
      api::BlindRawTransactionRequestStruct,
      api::BlindTransactionResponseStruct>(
      request_message,
      ElementsTransactionStructApi::BlindTransaction);  // NOLINT
}